

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void kj::_::Debug::log<char_const(&)[19],char_const(&)[26]>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [19],
               char (*params_1) [26])

{
  undefined4 in_register_00000014;
  char (*params_00) [26];
  long lVar1;
  String argValues [2];
  
  str<char_const(&)[19]>
            (argValues,(kj *)params,(char (*) [19])CONCAT44(in_register_00000014,severity));
  str<char_const(&)[26]>(argValues + 1,(kj *)params_1,params_00);
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)argValues,(ArrayPtr<kj::String>)argValues[0].content._0_16_);
  lVar1 = 0x18;
  do {
    Array<char>::~Array((Array<char> *)((long)&argValues[0].content.ptr + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}